

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr * __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::
ReadLogicalExpr_abi_cxx11_
          (LogicalExpr *__return_storage_ptr__,
          NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter> *this,int opcode)

{
  Kind KVar1;
  char *pcVar2;
  int iVar3;
  long *plVar4;
  NumericExpr lhs;
  LogicalExpr then_expr;
  LogicalExpr else_expr;
  BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::NumericExprReader>
  local_1e8;
  LogicalExpr local_1a8;
  LogicalExpr local_188;
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  size_type *local_128 [2];
  size_type local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  CountExpr local_68;
  LogicalExpr local_48;
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 != NOT) {
      if (KVar1 == FIRST_BINARY_LOGICAL) {
        NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::
        BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::LogicalExprReader>
        ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::LogicalExprReader>
                           *)&local_1e8,
                          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)this);
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e8,local_1e8.lhs._M_dataplus._M_p,
                   local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,local_1e8.rhs._M_dataplus._M_p,
                   local_1e8.rhs._M_dataplus._M_p + local_1e8.rhs._M_string_length);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        plVar4 = local_e8[0];
        if (local_e8[0] != local_d8) {
LAB_001244e1:
          operator_delete(plVar4,local_d8[0] + 1);
        }
      }
      else {
        if (KVar1 != FIRST_RELATIONAL) goto switchD_001240a9_caseD_3c;
        NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::
        BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::NumericExprReader>
        ::BinaryArgReader(&local_1e8,
                          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)this);
        local_108[0] = local_f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_108,local_1e8.lhs._M_dataplus._M_p,
                   local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,local_1e8.rhs._M_dataplus._M_p,
                   local_1e8.rhs._M_dataplus._M_p + local_1e8.rhs._M_string_length);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        local_d8[0] = local_f8[0];
        plVar4 = local_108[0];
        if (local_108[0] != local_f8) goto LAB_001244e1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.rhs._M_dataplus._M_p != &local_1e8.rhs.field_2) goto LAB_001244fc;
      goto LAB_00124504;
    }
    ReadLogicalExpr_abi_cxx11_(&local_48,this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00124517;
  }
  switch(KVar1) {
  case ATLEAST:
    plVar4 = *(long **)this;
    pcVar2 = (char *)*plVar4;
    plVar4[3] = (long)pcVar2;
    *plVar4 = (long)(pcVar2 + 1);
    ReadNumericExpr_abi_cxx11_(&local_1e8.lhs,this,*pcVar2,false);
    plVar4 = *(long **)this;
    pcVar2 = (char *)*plVar4;
    plVar4[3] = (long)pcVar2;
    *plVar4 = (long)(pcVar2 + 1);
    if ((*pcVar2 != 'o') ||
       (iVar3 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ReadOpCode
                          ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)this),
       OpCodeInfo::INFO[iVar3].kind != COUNT)) {
      local_188._M_string_length = (size_type)&local_1a8;
      local_1a8._M_dataplus._M_p = (pointer)0x0;
      local_1a8._M_string_length = 0;
      local_188._M_dataplus._M_p = (pointer)0x0;
      TextReader<fmt::Locale>::DoReportError
                (*(TextReader<fmt::Locale> **)this,
                 ((*(TextReader<fmt::Locale> **)this)->super_ReaderBase).token_,(CStringRef)0x139fdd
                 ,(ArgList *)&local_188);
    }
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,local_1e8.lhs._M_dataplus._M_p,
               local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
    ReadCountExpr_abi_cxx11_(&local_68,this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_1e8.rhs.field_2._M_allocated_capacity = local_118[0];
    local_1e8.rhs._M_dataplus._M_p = (pointer)local_128[0];
    if (local_128[0] != local_118) {
LAB_001244fc:
      operator_delete(local_1e8.rhs._M_dataplus._M_p,local_1e8.rhs.field_2._M_allocated_capacity + 1
                     );
    }
    break;
  default:
switchD_001240a9_caseD_3c:
    local_1e8.lhs._M_dataplus._M_p = (pointer)0x0;
    local_1e8.lhs._M_string_length = 0;
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    local_1a8._M_string_length = (size_type)&local_1e8;
    TextReader<fmt::Locale>::DoReportError
              (*(TextReader<fmt::Locale> **)this,
               ((*(TextReader<fmt::Locale> **)this)->super_ReaderBase).token_,(CStringRef)0x139ff7,
               (ArgList *)&local_1a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    goto LAB_00124557;
  case IMPLICATION:
    ReadLogicalExpr_abi_cxx11_(&local_1e8.lhs,this);
    ReadLogicalExpr_abi_cxx11_(&local_1a8,this);
    ReadLogicalExpr_abi_cxx11_(&local_188,this);
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,local_1e8.lhs._M_dataplus._M_p,
               local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + (long)(_Alloc_hider *)local_188._M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0],local_158[0] + 1);
    }
    if (local_148[0] != local_138) {
      operator_delete(local_148[0],local_138[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    local_1e8.rhs.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
    local_1e8.rhs._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_001244fc;
    break;
  case EXISTS:
    iVar3 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ReadNumArgs
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)this,3);
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3,(ArgHandler *)&local_1e8);
    goto LAB_001242b2;
  case ALLDIFF:
    iVar3 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ReadNumArgs
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)this,1);
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3,(ArgHandler *)&local_1e8);
LAB_001242b2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
LAB_00124557:
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
LAB_00124504:
  local_48.field_2._M_allocated_capacity = local_1e8.lhs.field_2._M_allocated_capacity;
  local_48._M_dataplus._M_p = local_1e8.lhs._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.lhs._M_dataplus._M_p != &local_1e8.lhs.field_2) {
LAB_00124517:
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}